

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

int __thiscall embree::CommandLineStream::next(CommandLineStream *this)

{
  size_type sVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  reference pvVar5;
  char *pcVar6;
  long in_RDI;
  undefined4 local_4;
  
  sVar1 = *(size_type *)(in_RDI + 0x40);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x50));
  if (sVar1 == sVar3) {
    local_4 = -1;
  }
  else {
    lVar2 = *(long *)(in_RDI + 0x48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x50),*(size_type *)(in_RDI + 0x40));
    lVar4 = std::__cxx11::string::size();
    if (lVar2 == lVar4) {
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
      *(undefined8 *)(in_RDI + 0x48) = 0;
      *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + 1;
      local_4 = 0x20;
    }
    else {
      *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + 1;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x50),*(size_type *)(in_RDI + 0x40));
      *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
      local_4 = (int)*pcVar6;
    }
  }
  return local_4;
}

Assistant:

int next() {
      if (i == args.size()) return EOF;
      if (j == args[i].size()) { i++; j=0; charNumber++; return ' '; }
      charNumber++;
      return args[i][j++];
    }